

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

Gia_Man_t *
Gia_ManFindPoPartition
          (Gia_Man_t *p,int SelectShift,int fOnlyCis,int fSetLargest,int fVerbose,
          Vec_Ptr_t **pvPosEquivs)

{
  int nPos;
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Int_t *pVVar4;
  Vec_Wrd_t *vSigns_00;
  Vec_Ptr_t *p_00;
  int *pPos;
  abctime aVar5;
  abctime clk;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vParts;
  Vec_Wrd_t *vSigns;
  Vec_Int_t *vPivots;
  Gia_Man_t *pGia;
  Vec_Ptr_t **pvPosEquivs_local;
  int fVerbose_local;
  int fSetLargest_local;
  int fOnlyCis_local;
  int SelectShift_local;
  Gia_Man_t *p_local;
  
  vPivots = (Vec_Int_t *)0x0;
  aVar3 = Abc_Clock();
  pVVar4 = Gia_ManFindPivots(p,SelectShift,fOnlyCis,fVerbose);
  vSigns_00 = Gia_ManDeriveSigns(p,pVVar4,fVerbose);
  Vec_IntFree(pVVar4);
  p_00 = Gia_ManHashOutputs(p,vSigns_00,fVerbose);
  Vec_WrdFree(vSigns_00);
  if (fSetLargest != 0) {
    pVVar4 = Vec_VecEntryInt((Vec_Vec_t *)p_00,0);
    pPos = Vec_IntArray(pVVar4);
    nPos = Vec_IntSize(pVVar4);
    vPivots = (Vec_Int_t *)Gia_ManDupCones(p,pPos,nPos,1);
  }
  if (pvPosEquivs == (Vec_Ptr_t **)0x0) {
    Vec_VecFree((Vec_Vec_t *)p_00);
  }
  else {
    *pvPosEquivs = p_00;
    uVar1 = Gia_ManPoNum(p);
    uVar2 = Vec_PtrSize(p_00);
    printf("The algorithm divided %d POs into %d partitions.   ",(ulong)uVar1,(ulong)uVar2);
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - aVar3);
  }
  return (Gia_Man_t *)vPivots;
}

Assistant:

Gia_Man_t * Gia_ManFindPoPartition( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs )
{
    Gia_Man_t * pGia = NULL;
    Vec_Int_t * vPivots;
    Vec_Wrd_t * vSigns;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vPart;
    abctime clk = Abc_Clock();
    vPivots = Gia_ManFindPivots( p, SelectShift, fOnlyCis, fVerbose );
    vSigns = Gia_ManDeriveSigns( p, vPivots, fVerbose );
    Vec_IntFree( vPivots );
    vParts = Gia_ManHashOutputs( p, vSigns, fVerbose );
    Vec_WrdFree( vSigns );
    if ( fSetLargest )
    {
        vPart = Vec_VecEntryInt( (Vec_Vec_t *)vParts, 0 );
        pGia = Gia_ManDupCones( p, Vec_IntArray(vPart), Vec_IntSize(vPart), 1 );
    }
    if ( pvPosEquivs )
    {
        *pvPosEquivs = vParts;
        printf( "The algorithm divided %d POs into %d partitions.   ", Gia_ManPoNum(p), Vec_PtrSize(vParts) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    else
        Vec_VecFree( (Vec_Vec_t *)vParts );
    return pGia;
}